

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceTest.cpp
# Opt level: O3

void __thiscall
StackTraceTest_moveAssignment_Test::TestBody(StackTraceTest_moveAssignment_Test *this)

{
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar1;
  StackTraceImpl *pSVar2;
  bool bVar3;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertHelper local_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  StackTraceImpl *local_30;
  string local_28;
  
  cppassert::internal::StackTrace::getStackTrace();
  local_40[0] = (internal)(local_30->backtraceSize_ != 2);
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_40,(AssertionResult *)"frames.size()>0","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/StackTraceTest.cpp"
               ,0x12,local_28._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
    if ((StackTraceImpl *)local_50.ptr_ != (StackTraceImpl *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((StackTraceImpl *)local_50.ptr_ != (StackTraceImpl *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cppassert::internal::StackTrace::getStackTrace();
  local_40[0] = (internal)(*(size_t *)(local_50.ptr_ + 0x2808) != 2);
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_40,(AssertionResult *)"other.size()>0","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/StackTraceTest.cpp"
               ,0x14,local_28._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_58.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pSVar2 = local_30;
  sVar1.ptr_ = local_50.ptr_;
  local_30 = (StackTraceImpl *)0x0;
  local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar2;
  if ((StackTraceImpl *)sVar1.ptr_ != (StackTraceImpl *)0x0) {
    cppassert::internal::StackTraceImpl::~StackTraceImpl((StackTraceImpl *)sVar1.ptr_);
    operator_delete(sVar1.ptr_);
  }
  local_40[0] = (internal)(*(size_t *)(local_50.ptr_ + 0x2808) != 2);
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_40,(AssertionResult *)"other.size()>0","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/StackTraceTest.cpp"
               ,0x16,local_28._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_58.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar1.ptr_ = local_50.ptr_;
  if ((StackTraceImpl *)local_50.ptr_ != (StackTraceImpl *)0x0) {
    cppassert::internal::StackTraceImpl::~StackTraceImpl((StackTraceImpl *)local_50.ptr_);
    operator_delete(sVar1.ptr_);
  }
  pSVar2 = local_30;
  if (local_30 != (StackTraceImpl *)0x0) {
    cppassert::internal::StackTraceImpl::~StackTraceImpl(local_30);
    operator_delete(pSVar2);
  }
  return;
}

Assistant:

TEST(StackTraceTest, moveAssignment)
{
    StackTrace frames = StackTrace::getStackTrace();
    EXPECT_TRUE(frames.size()>0);
    StackTrace other = StackTrace::getStackTrace();
    EXPECT_TRUE(other.size()>0);
    other = std::move(frames);
    EXPECT_TRUE(other.size()>0);
}